

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerMixin.cpp
# Opt level: O2

TimerId __thiscall
Liby::TimerMixin::runAfter(TimerMixin *this,Timestamp *timestamp,BasicHandler *handler)

{
  int iVar1;
  TimerId TVar2;
  
  if (runAfter(Liby::Timestamp_const&,std::function<void()>const&)::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&runAfter(Liby::Timestamp_const&,std::function<void()>const&)::
                                 helper);
    if (iVar1 != 0) {
      __cxa_guard_release(&runAfter(Liby::Timestamp_const&,std::function<void()>const&)::helper);
    }
  }
  EventLoop::runAfter((EventLoop *)&stack0xffffffffffffffd0,(Timestamp *)this->loop_,
                      (BasicHandler *)timestamp);
  TVar2 = runHelper(this,(TimerHolder *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  return TVar2;
}

Assistant:

TimerId TimerMixin::runAfter(const Timestamp &timestamp,
                             const BasicHandler &handler) {
    static TimerMixinHelper helper(&loop_);
    return runHelper(loop_->runAfter(timestamp, handler));
}